

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.hpp
# Opt level: O3

Matrix<float> __thiscall Matrix<float>::operator+(Matrix<float> *this,Matrix<float> *M1)

{
  uint uVar1;
  int iVar2;
  float *pfVar3;
  float **ppfVar4;
  float *pfVar5;
  long lVar6;
  float *pfVar7;
  float **in_RDX;
  float **ppfVar8;
  float **extraout_RDX;
  long lVar9;
  ulong uVar10;
  Matrix<float> MVar11;
  
  ppfVar8 = in_RDX;
  if (M1->n == *(int *)in_RDX) {
    uVar1 = M1->m;
    ppfVar8 = (float **)(ulong)uVar1;
    if (uVar1 == *(uint *)((long)in_RDX + 4)) {
      Matrix(this,M1->n,uVar1);
      iVar2 = M1->n;
      ppfVar8 = extraout_RDX;
      if (0 < (long)iVar2) {
        uVar1 = M1->m;
        ppfVar8 = M1->M;
        pfVar3 = in_RDX[1];
        ppfVar4 = this->M;
        lVar9 = 0;
        do {
          if (0 < (int)uVar1) {
            pfVar5 = ppfVar8[lVar9];
            lVar6 = *(long *)(pfVar3 + lVar9 * 2);
            pfVar7 = ppfVar4[lVar9];
            uVar10 = 0;
            do {
              pfVar7[uVar10] = pfVar5[uVar10] + *(float *)(lVar6 + uVar10 * 4);
              uVar10 = uVar10 + 1;
            } while (uVar1 != uVar10);
          }
          lVar9 = lVar9 + 1;
        } while (lVar9 != iVar2);
      }
      goto LAB_0010b4a4;
    }
  }
  this->n = 0;
  this->m = 0;
  this->M = (float **)0x0;
LAB_0010b4a4:
  MVar11.M = ppfVar8;
  MVar11._0_8_ = this;
  return MVar11;
}

Assistant:

Matrix operator+(const Matrix& M1) const {
    if (n != M1.n || m != M1.m) {
      Matrix<T> Zero;
      return Zero;
    }
    Matrix<T> add(n, m);
    for (int i = 0; i < n; i++) {
      for (int j = 0; j < m; j++) {
        add.M[i][j] = M[i][j] + M1.M[i][j];
      }
    }
    return add;
  }